

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsDatabase.cpp
# Opt level: O3

bool DnsDatabase::resolve(String *hostname,uint32 *addr)

{
  uint32 uVar1;
  bool bVar2;
  Iterator IVar3;
  time_t tVar4;
  AddrInfo *value;
  String *pSVar5;
  String *__timer;
  Item *__timer_00;
  AddrInfo addrInfo;
  uint32 local_30;
  char *local_28;
  
  pSVar5 = (String *)addr;
  Mutex::lock((Mutex *)(anonymous_namespace)::_mutex);
  __timer = hostname;
  IVar3 = HashMap<String,_(anonymous_namespace)::AddrInfo>::find
                    ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)hostname,pSVar5);
  if ((anonymous_namespace)::_nameToAddr != IVar3.item) {
    uVar1 = ((IVar3.item)->value).addr;
    *addr = uVar1;
    tVar4 = Time::time((time_t *)__timer);
    if (tVar4 - ((IVar3.item)->value).timestamp < 0x927c1) {
      bVar2 = uVar1 != 0;
      goto LAB_0010642a;
    }
  }
  Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
  pSVar5 = (String *)addr;
  bVar2 = Socket::getHostByName(hostname,addr);
  Mutex::lock((Mutex *)(anonymous_namespace)::_mutex);
  __timer_00 = (Item *)hostname;
  IVar3 = HashMap<String,_(anonymous_namespace)::AddrInfo>::find
                    ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)hostname,pSVar5);
  if ((anonymous_namespace)::_nameToAddr != IVar3.item) {
    if (((IVar3.item)->value).addr != 0) {
      pSVar5 = (String *)&(IVar3.item)->value;
      HashMap<unsigned_int,_String>::remove
                ((HashMap<unsigned_int,_String> *)&(anonymous_namespace)::_addrToName,(char *)pSVar5
                );
    }
    HashMap<String,_(anonymous_namespace)::AddrInfo>::remove
              ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)IVar3.item,(char *)pSVar5);
    __timer_00 = IVar3.item;
  }
  local_30 = 0;
  if (bVar2) {
    local_30 = *addr;
  }
  local_28 = (char *)Time::time((time_t *)__timer_00);
  HashMap<String,_(anonymous_namespace)::AddrInfo>::append
            ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)hostname,(String *)&local_30,value)
  ;
  if (bVar2) {
    HashMap<unsigned_int,_String>::insert
              ((HashMap<unsigned_int,_String> *)&(anonymous_namespace)::_addrToName,
               (Iterator *)&(anonymous_namespace)::_addrToName,addr,hostname);
  }
LAB_0010642a:
  Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
  return bVar2;
}

Assistant:

bool DnsDatabase::resolve(const String& hostname, uint32& addr)
{
    {
        _mutex.lock();
        HashMap<String, AddrInfo>::Iterator it = _nameToAddr.find(hostname);
        if (it != _nameToAddr.end())
        {
            const AddrInfo& addrInfo = *it;
            addr = addrInfo.addr;
            bool result = addrInfo.addr != 0;
            if (Time::time() - addrInfo.timestamp <= 10 * 60 * 1000) // the cached entry should not be older than 10 minutes
            {
                _mutex.unlock();
                return result;
            }
        }
        _mutex.unlock();
    }

    bool result = Socket::getHostByName(hostname, addr);

    {
        _mutex.lock();
        HashMap<String, AddrInfo>::Iterator it = _nameToAddr.find(hostname);
        if (it != _nameToAddr.end())
        {
            if (it->addr != 0)
                _addrToName.remove(it->addr);
            _nameToAddr.remove(it);
        }
        AddrInfo addrInfo = {result ? addr : 0, Time::time()};
        _nameToAddr.append(hostname, addrInfo);
        if (result)
            _addrToName.append(addr, hostname);
        _mutex.unlock();
    }

    return result;
}